

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O2

string * __thiscall CPT::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,CPT *this)

{
  size_type sVar1;
  size_type sVar2;
  ostream *poVar3;
  size_t x;
  size_type sVar4;
  size_t y;
  size_type sVar5;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  sVar1 = (this->_m_probTable).size2_;
  sVar2 = (this->_m_probTable).size1_;
  for (sVar5 = 0; sVar5 != sVar1; sVar5 = sVar5 + 1) {
    poVar3 = std::operator<<(local_1a8,"CPT y=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," x:");
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      std::operator<<(local_1a8," ");
      std::ostream::_M_insert<double>
                ((this->_m_probTable).data_.data_[(this->_m_probTable).size2_ * sVar4 + sVar5]);
    }
    std::endl<char,std::char_traits<char>>(local_1a8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string CPT::SoftPrint() const
{
    stringstream ss;
    size_t X = _m_probTable.size1();
    size_t Y = _m_probTable.size2();
    for(size_t y=0; y < Y; y++) 
    {
        ss << "CPT y=" << y << " x:";
        for(size_t x=0; x < X; x++) 
            ss << " " << _m_probTable(x,y);
        ss << endl;
    }
    return(ss.str());
}